

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_impl.h
# Opt level: O0

void ** google::protobuf::internal::TcParser::RefAt<void*>(void *x,size_t offset)

{
  void **ppvVar1;
  void **target;
  size_t offset_local;
  void *x_local;
  
  ppvVar1 = (void **)((long)x + offset);
  if (((ulong)ppvVar1 & 7) != 0) {
    AlignFail(ppvVar1);
  }
  return ppvVar1;
}

Assistant:

static inline T& RefAt(void* x, size_t offset) {
    T* target = reinterpret_cast<T*>(static_cast<char*>(x) + offset);
#if !defined(NDEBUG) && !(defined(_MSC_VER) && defined(_M_IX86))
    // Check the alignment in debug mode, except in 32-bit msvc because it does
    // not respect the alignment as expressed by `alignof(T)`
    if (ABSL_PREDICT_FALSE(reinterpret_cast<uintptr_t>(target) % alignof(T) !=
                           0)) {
      AlignFail(std::integral_constant<size_t, alignof(T)>(),
                reinterpret_cast<uintptr_t>(target));
    }
#endif
    return *target;
  }